

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkStartFaninMap(Wln_Ntk_t *p,Vec_Int_t *vFaninMap,int nMulti)

{
  int iVar1;
  int local_24;
  int local_20;
  int iOffset;
  int iObj;
  int nMulti_local;
  Vec_Int_t *vFaninMap_local;
  Wln_Ntk_t *p_local;
  
  local_24 = Wln_NtkObjNum(p);
  iVar1 = Wln_NtkFaninNum(p);
  Vec_IntFill(vFaninMap,local_24 + nMulti * iVar1,0);
  local_20 = 1;
  while( true ) {
    iVar1 = Wln_NtkObjNum(p);
    if (iVar1 <= local_20) break;
    Vec_IntWriteEntry(vFaninMap,local_20,local_24);
    iVar1 = Wln_ObjFaninNum(p,local_20);
    local_24 = nMulti * iVar1 + local_24;
    local_20 = local_20 + 1;
  }
  iVar1 = Vec_IntSize(vFaninMap);
  if (local_24 == iVar1) {
    return;
  }
  __assert_fail("iOffset == Vec_IntSize(vFaninMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNtk.c"
                ,0xfb,"void Wln_NtkStartFaninMap(Wln_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Wln_NtkStartFaninMap( Wln_Ntk_t * p, Vec_Int_t * vFaninMap, int nMulti )
{
    int iObj, iOffset = Wln_NtkObjNum(p);
    Vec_IntFill( vFaninMap, iOffset + nMulti * Wln_NtkFaninNum(p), 0 );
    Wln_NtkForEachObj( p, iObj )
    {
        Vec_IntWriteEntry( vFaninMap, iObj, iOffset );
        iOffset += nMulti * Wln_ObjFaninNum(p, iObj);
    }
    assert( iOffset == Vec_IntSize(vFaninMap) );
}